

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_setfenv(lua_State *L,int idx)

{
  uint uVar1;
  TValue *g;
  int in_ESI;
  lua_State *in_RDI;
  GCtab *t;
  cTValue *o;
  
  g = index2adr(in_RDI,in_ESI);
  uVar1 = in_RDI->top[-1].u32.lo;
  if ((g->field_2).it == 0xfffffff7) {
    *(uint *)((ulong)(g->u32).lo + 8) = uVar1;
  }
  else if ((g->field_2).it == 0xfffffff3) {
    *(uint *)((ulong)(g->u32).lo + 8) = uVar1;
  }
  else {
    if ((g->field_2).it != 0xfffffff9) {
      in_RDI->top = in_RDI->top + -1;
      return 0;
    }
    *(uint *)((ulong)(g->u32).lo + 0x2c) = uVar1;
  }
  if ((((((GCobj *)(ulong)uVar1)->gch).marked & 3) != 0) &&
     ((*(byte *)((ulong)(g->u32).lo + 4) & 4) != 0)) {
    lj_gc_barrierf((global_State *)&g->field_2,(GCobj *)(ulong)uVar1,(GCobj *)0x116e95);
  }
  in_RDI->top = in_RDI->top + -1;
  return 1;
}

Assistant:

LUA_API int lua_setfenv(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  GCtab *t;
  api_checknelems(L, 1);
  api_checkvalidindex(L, o);
  api_check(L, tvistab(L->top-1));
  t = tabV(L->top-1);
  if (tvisfunc(o)) {
    setgcref(funcV(o)->c.env, obj2gco(t));
  } else if (tvisudata(o)) {
    setgcref(udataV(o)->env, obj2gco(t));
  } else if (tvisthread(o)) {
    setgcref(threadV(o)->env, obj2gco(t));
  } else {
    L->top--;
    return 0;
  }
  lj_gc_objbarrier(L, gcV(o), t);
  L->top--;
  return 1;
}